

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

char * coda_type_get_special_type_name(coda_special_type special_type)

{
  char *pcStack_10;
  coda_special_type special_type_local;
  
  switch(special_type) {
  case coda_special_no_data:
    pcStack_10 = "no_data";
    break;
  case coda_special_vsf_integer:
    pcStack_10 = "vsf_integer";
    break;
  case coda_special_time:
    pcStack_10 = "time";
    break;
  case coda_special_complex:
    pcStack_10 = "complex";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

LIBCODA_API const char *coda_type_get_special_type_name(coda_special_type special_type)
{
    switch (special_type)
    {
        case coda_special_no_data:
            return "no_data";
        case coda_special_vsf_integer:
            return "vsf_integer";
        case coda_special_time:
            return "time";
        case coda_special_complex:
            return "complex";
    }

    return "unknown";
}